

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O0

int lzham::lzham_lib_z_inflateInit2(lzham_z_streamp pStream,int window_bits)

{
  long lVar1;
  lzham_decompress_state_ptr pvVar2;
  int in_ESI;
  long in_RDI;
  lzham_decompress_state_ptr pState;
  lzham_decompress_params params;
  int max_window_bits;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar3;
  int local_14;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = -2;
  }
  else {
    lVar1 = (long)in_ESI;
    if (lVar1 < 1) {
      lVar1 = -lVar1;
    }
    if (lVar1 < 0x1e) {
      lVar1 = (long)in_ESI;
      if (lVar1 < 1) {
        lVar1 = -lVar1;
      }
      local_14 = in_ESI;
      if ((lVar1 < 0xf) && (local_14 = 0xf, in_ESI < 0)) {
        local_14 = -0xf;
      }
      utils::zero_object<lzham_decompress_params>((lzham_decompress_params *)0x108a47);
      uVar3 = 2;
      if (0 < local_14) {
        uVar3 = 6;
      }
      pvVar2 = lzham_lib_decompress_init
                         ((lzham_decompress_params *)CONCAT44(uVar3,in_stack_ffffffffffffffc8));
      if (pvVar2 == (lzham_decompress_state_ptr)0x0) {
        local_4 = -4;
      }
      else {
        *(lzham_decompress_state_ptr *)(in_RDI + 0x38) = pvVar2;
        *(undefined4 *)(in_RDI + 0x58) = 0;
        *(undefined8 *)(in_RDI + 0x60) = 1;
        *(undefined8 *)(in_RDI + 0x30) = 0;
        *(undefined8 *)(in_RDI + 0x10) = 0;
        *(undefined8 *)(in_RDI + 0x28) = 0;
        *(undefined8 *)(in_RDI + 0x68) = 0;
        local_4 = 0;
      }
    }
    else {
      local_4 = -10000;
    }
  }
  return local_4;
}

Assistant:

int LZHAM_CDECL lzham_lib_z_inflateInit2(lzham_z_streamp pStream, int window_bits)
   {
      if (!pStream) 
         return LZHAM_Z_STREAM_ERROR;
      
#ifdef LZHAM_Z_API_FORCE_WINDOW_BITS
      window_bits = LZHAM_Z_API_FORCE_WINDOW_BITS;
#endif      

      int max_window_bits = LZHAM_64BIT_POINTERS ? LZHAM_MAX_DICT_SIZE_LOG2_X64 : LZHAM_MAX_DICT_SIZE_LOG2_X86;
      if (labs(window_bits) > max_window_bits)
         return LZHAM_Z_PARAM_ERROR;

      if (labs(window_bits) < LZHAM_MIN_DICT_SIZE_LOG2)
         window_bits = (window_bits < 0) ? -LZHAM_MIN_DICT_SIZE_LOG2 : LZHAM_MIN_DICT_SIZE_LOG2;
      
      lzham_decompress_params params;
      utils::zero_object(params);
      params.m_struct_size = sizeof(lzham_decompress_params);
      params.m_dict_size_log2 = static_cast<lzham_uint32>(labs(window_bits));
      
      params.m_decompress_flags = LZHAM_DECOMP_FLAG_COMPUTE_ADLER32;
      if (window_bits > 0)
         params.m_decompress_flags |= LZHAM_DECOMP_FLAG_READ_ZLIB_STREAM;
      
      lzham_decompress_state_ptr pState = lzham_lib_decompress_init(&params);
      if (!pState)
         return LZHAM_Z_MEM_ERROR;
      pStream->state = static_cast<lzham_z_internal_state *>(pState);

      pStream->data_type = 0;
      pStream->adler = LZHAM_Z_ADLER32_INIT;
      pStream->msg = NULL;
      pStream->total_in = 0;
      pStream->total_out = 0;
      pStream->reserved = 0;
            
      return LZHAM_Z_OK;
   }